

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::AndroidZoneInfoSource::
~AndroidZoneInfoSource(AndroidZoneInfoSource *this)

{
  AndroidZoneInfoSource *this_local;
  
  (this->super_FileZoneInfoSource).super_ZoneInfoSource._vptr_ZoneInfoSource =
       (_func_int **)&PTR__AndroidZoneInfoSource_00a41ad0;
  std::__cxx11::string::~string((string *)&this->version_);
  FileZoneInfoSource::~FileZoneInfoSource(&this->super_FileZoneInfoSource);
  return;
}

Assistant:

std::string Version() const override { return version_; }